

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baillie_bench.cpp
# Opt level: O3

void BM_rabinMiller(State *state)

{
  State SVar1;
  bool bVar2;
  mapped_type *pmVar3;
  long lVar4;
  key_type local_50;
  
  lVar4 = *(long *)(state + 0x10);
  SVar1 = state[0x1a];
  benchmark::State::StartKeepRunning(state);
  if ((SVar1 == (State)0x0) && (lVar4 != 0)) {
    do {
      if (*(unsigned_long **)(state + 0x28) == *(unsigned_long **)(state + 0x20)) {
        __assert_fail("range_.size() > pos",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/bitwyre[P]baillie_psw/benchmark.h"
                      ,0x272,"int64_t benchmark::State::range(std::size_t) const");
      }
      bVar2 = baillieTest(**(unsigned_long **)(state + 0x20));
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"IS PRIME","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter>_>_>
                             *)(state + 0x40),&local_50);
      pmVar3->value = (double)bVar2;
      pmVar3->flags = kDefaults;
      pmVar3->oneK = kIs1000;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  BM_rabinMiller();
  return;
}

Assistant:

static void BM_rabinMiller(benchmark::State& state) {

  for (auto _ : state) {
      int k = 4;
      auto res = baillieTest(state.range(0));
      state.counters["IS PRIME"] = res; 
  }
  state.SetComplexityN(state.range(0));
}